

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O1

void ZXing::DivideWithRemainder(Magnitude *a,Magnitude *b,Magnitude *qq,Magnitude *rr)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  char cVar3;
  bool bVar4;
  Magnitude *pMVar5;
  Magnitude *pMVar6;
  long lVar7;
  pointer puVar8;
  Magnitude *pMVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  Magnitude *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar17;
  size_t j;
  long lVar18;
  bool bVar19;
  Magnitude subtractBuf;
  Magnitude tmp2;
  Magnitude tmp;
  allocator_type local_e9;
  Magnitude *local_e8;
  Magnitude *local_e0;
  pointer local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  Magnitude local_98;
  pointer local_80;
  Magnitude *local_78;
  Magnitude *local_70;
  Magnitude *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  pointer local_40;
  ulong local_38;
  
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar9 = qq;
  if (qq == b) {
    pMVar9 = &local_98;
  }
  local_e0 = pMVar9;
  if (qq == a) {
    local_e0 = &local_98;
  }
  this = rr;
  if (rr == b) {
    this = &local_b8;
  }
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar2 == puVar8) ||
     (uVar12 = (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start, uVar12 < (ulong)((long)puVar8 - (long)puVar2)
     )) {
    puVar2 = (qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(rr,a);
  }
  else {
    local_e8 = pMVar9;
    if (this != a) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (this,((long)uVar12 >> 3) + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this,a);
    }
    pMVar9 = &local_b8;
    if (rr != b) {
      pMVar9 = rr;
    }
    local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __position._M_current =
         (pMVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pMVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (this,__position,(unsigned_long *)&local_d0);
    }
    else {
      *__position._M_current = 0;
      (pMVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_68 = pMVar9;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_d0,
               (long)(pMVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_e9);
    pMVar9 = local_e0;
    local_70 = rr;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (local_e0,(((long)(a->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(a->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3) -
                        ((long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3)) + 1);
    local_78 = qq;
    if (qq == a) {
      local_e8 = &local_98;
    }
    local_80 = (local_e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    local_d8 = (pMVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    lVar13 = (long)local_80 - (long)local_d8;
    if (lVar13 != 0) {
      local_38 = lVar13 >> 3;
      puVar2 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
      local_50 = (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
      local_58 = -local_38;
      lVar10 = (long)(this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar13 + -8;
      lVar13 = lVar13 + -8 +
               (long)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_60 = this;
      pvVar17 = this;
      do {
        local_58 = local_58 + 1;
        local_d8[local_38 - 1] = 0;
        local_38 = local_38 - 1;
        local_40 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_48 = -local_58;
        lVar7 = 0x40;
        do {
          cVar3 = (char)lVar7;
          lVar7 = lVar7 + -1;
          lVar18 = 0;
          bVar19 = false;
          do {
            uVar12 = *(ulong *)(lVar10 + lVar18 * 8);
            if (lVar18 == 0 || lVar7 == 0) {
              uVar14 = 0;
            }
            else {
              uVar14 = puVar2[lVar18 + -1] >> (0x41U - cVar3 & 0x3f);
            }
            if (lVar16 == lVar18) {
              uVar11 = 0;
            }
            else {
              uVar11 = puVar2[lVar18] << ((byte)lVar7 & 0x3f);
            }
            uVar15 = uVar12 - (uVar11 | uVar14);
            uVar1 = uVar15 - 1;
            bVar4 = !bVar19;
            bVar19 = uVar12 <= uVar1;
            if (bVar4) {
              uVar1 = uVar15;
              bVar19 = uVar12 < (uVar11 | uVar14);
            }
            *(ulong *)(lVar13 + lVar18 * 8) = uVar1;
            lVar18 = lVar18 + 1;
          } while (lVar16 + 1 + (ulong)(lVar16 == -1) != lVar18);
          uVar12 = lVar18 + local_48;
          if ((bool)(uVar12 < local_50 & bVar19)) {
            do {
              bVar19 = local_40[uVar12] == 0;
              local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] = local_40[uVar12] - 1;
              uVar12 = uVar12 + 1;
              if (local_50 <= uVar12) break;
            } while (bVar19);
          }
          if (!bVar19) {
            local_d8[local_38] = local_d8[local_38] | 1L << ((byte)lVar7 & 0x3f);
            for (; local_38 < uVar12; uVar12 = uVar12 - 1) {
              local_40[uVar12 - 1] =
                   local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12 - 1];
            }
          }
        } while (lVar7 != 0);
        lVar10 = lVar10 + -8;
        lVar13 = lVar13 + -8;
        pvVar17 = local_60;
      } while (local_38 != 0);
    }
    if (local_80[-1] == 0) {
      (local_e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_80 + -1;
    }
    pMVar6 = local_68;
    pMVar5 = local_70;
    pMVar9 = local_78;
    puVar2 = (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    while ((puVar2 != puVar8 && (puVar8 = puVar8 + -1, *puVar8 == 0))) {
      (pMVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
    }
    if (local_e0 != pMVar9) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign();
    }
    if (this != pMVar5) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(pMVar5,this);
    }
    if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void DivideWithRemainder(const Magnitude& a, const Magnitude& b, Magnitude& qq, Magnitude& rr)
{
	/* Defending against aliased calls is more complex than usual because we
	* are writing to both r and q.
	*
	* It would be silly to try to write quotient and remainder to the
	* same variable.  Rule that out right away. */
	assert(&rr != &qq);

	Magnitude tmp, tmp2;
	Magnitude& q = &qq == &a || &qq == &b ? tmp : qq;
	Magnitude& r = &rr == &b ? tmp2 : rr;

	/*
	* Knuth's definition of mod (which this function uses) is somewhat
	* different from the C++ definition of % in case of division by 0.
	*
	* We let a / 0 == 0 (it doesn't matter much) and a % 0 == a, no
	* exceptions thrown.  This allows us to preserve both Knuth's demand
	* that a mod 0 == a and the useful property that
	* (a / b) * b + (a % b) == a.
	*/
	/*
	* If a.len < b.len, then a < b, and we can be sure that b doesn't go into
	* a at all.  The quotient is 0 and *this is already the remainder (so leave it alone).
	*/
	if (b.empty() || a.size() < b.size()) {
		qq.clear();
		rr = a;
		return;
	}

	// At this point we know a.len >= b.len > 0.  (Whew!)

	/*
	* Overall method:
	*
	* For each appropriate i and i2, decreasing:
	*    Subtract (b << (i blocks and i2 bits)) from *this, storing the
	*      result in subtractBuf.
	*    If the subtraction succeeds with a nonnegative result:
	*        Turn on bit i2 of block i of the quotient q.
	*        Copy subtractBuf back into *this.
	*    Otherwise bit i2 of block i remains off, and *this is unchanged.
	*
	* Eventually q will contain the entire quotient, and *this will
	* be left with the remainder.
	*
	* subtractBuf[x] corresponds to blk[x], not blk[x+i], since 2005.01.11.
	* But on a single iteration, we don't touch the i lowest blocks of blk
	* (and don't use those of subtractBuf) because these blocks are
	* unaffected by the subtraction: we are subtracting
	* (b << (i blocks and i2 bits)), which ends in at least `i' zero
	* blocks. */

	/*
	* Make sure we have an extra zero block just past the value.
	*
	* When we attempt a subtraction, we might shift `b' so
	* its first block begins a few bits left of the dividend,
	* and then we'll try to compare these extra bits with
	* a nonexistent block to the left of the dividend.  The
	* extra zero block ensures sensible behavior; we need
	* an extra block in `subtractBuf' for exactly the same reason.
	*/
	if (&r != &a) {
		r.reserve(a.size() + 1);
		r = a;
	}
	r.push_back(0);

	Magnitude subtractBuf(r.size());

	// Set preliminary length for quotient and make room
	q.resize(a.size() - b.size() + 1);

	// For each possible left-shift of b in blocks...
	size_t i = q.size();
	while (i > 0) {
		i--;
		// For each possible left-shift of b in bits...
		// (Remember, N is the number of bits in a Blk.)
		q[i] = 0;
		size_t i2 = NB_BITS;
		while (i2 > 0) {
			i2--;
			/*
			* Subtract b, shifted left i blocks and i2 bits, from *this,
			* and store the answer in subtractBuf.  In the for loop, `k == i + j'.
			*
			* Compare this to the middle section of `multiply'.  They
			* are in many ways analogous.  See especially the discussion
			* of `getShiftedBlock'.
			*/
			size_t k = i;
			bool borrowIn = false;
			for (size_t j = 0; j <= b.size(); ++j, ++k) {
				auto temp = r[k] - GetShiftedBlock(b, j, i2);
				bool borrowOut = (temp > r[k]);
				if (borrowIn) {
					borrowOut |= (temp == 0);
					temp--;
				}
				// Since 2005.01.11, indices of `subtractBuf' directly match those of `blk', so use `k'.
				subtractBuf[k] = temp;
				borrowIn = borrowOut;
			}
			// No more extra iteration to deal with `bHigh'.
			// Roll-over a borrow as necessary.
			for (; k < a.size() && borrowIn; k++) {
				borrowIn = (r[k] == 0);
				subtractBuf[k] = r[k] - 1;
			}
			/*
			* If the subtraction was performed successfully (!borrowIn),
			* set bit i2 in block i of the quotient.
			*
			* Then, copy the portion of subtractBuf filled by the subtraction
			* back to *this.  This portion starts with block i and ends--
			* where?  Not necessarily at block `i + b.len'!  Well, we
			* increased k every time we saved a block into subtractBuf, so
			* the region of subtractBuf we copy is just [i, k).
			*/
			if (!borrowIn) {
				q[i] |= (Block(1) << i2);
				while (k > i) {
					k--;
					r[k] = subtractBuf[k];
				}
			}
		}
	}
	// Zap possible leading zero in quotient
	if (q.back() == 0)
		q.pop_back();
	
	// Zap any/all leading zeros in remainder
	while (!r.empty() && r.back() == 0) {
		r.pop_back();
	}

	if (&qq != &q)
		qq = std::move(q);
	if (&rr != &r)
		rr = std::move(r);
}